

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall
Diligent::GLContextState::BlitFramebufferNoScissor
          (GLContextState *this,GLint srcX0,GLint srcY0,GLint srcX1,GLint srcY1,GLint dstX0,
          GLint dstY0,GLint dstX1,GLint dstY1,GLbitfield mask,GLenum filter)

{
  ENABLE_STATE EVar1;
  GLenum err;
  GLContextState *local_58;
  string msg;
  
  EVar1 = (this->m_RSState).ScissorTestEnable.m_EnableState;
  local_58 = this;
  if (EVar1 == ENABLED) {
    EnableScissorTest(this,false);
  }
  (*__glewBlitFramebuffer)(srcX0,srcY0,srcX1,srcY1,dstX0,dstY0,dstX1,dstY1,mask,filter);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[27],char[17],unsigned_int>
              (false,"BlitFramebufferNoScissor",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x3a9,(char (*) [27])"glBlitFramebuffer() failed",(char (*) [17])"\nGL Error Code: "
               ,&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x32952e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BlitFramebufferNoScissor",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x3a9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (EVar1 == ENABLED) {
    EnableScissorTest(local_58,true);
  }
  return;
}

Assistant:

void GLContextState::BlitFramebufferNoScissor(GLint      srcX0,
                                              GLint      srcY0,
                                              GLint      srcX1,
                                              GLint      srcY1,
                                              GLint      dstX0,
                                              GLint      dstY0,
                                              GLint      dstX1,
                                              GLint      dstY1,
                                              GLbitfield mask,
                                              GLenum     filter)
{
    bool ScissorEnabled = m_RSState.ScissorTestEnable;
    if (ScissorEnabled)
        EnableScissorTest(false);

    glBlitFramebuffer(srcX0, srcY0, srcX1, srcY1, dstX0, dstY0, dstX1, dstY1, mask, filter);
    DEV_CHECK_GL_ERROR("glBlitFramebuffer() failed");

    if (ScissorEnabled)
        EnableScissorTest(true);
}